

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O1

int Imf_3_4::SplitChannels<Imf_3_4::MultiViewChannelName*>
              (MultiViewChannelName **begin,MultiViewChannelName **end,bool multipart,
              string *heroView)

{
  string *psVar1;
  _Base_ptr __n;
  size_t __n_00;
  pointer pcVar2;
  int iVar3;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  const_iterator cVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  _Base_ptr *pp_Var11;
  undefined7 in_register_00000011;
  int iVar12;
  undefined8 uVar13;
  _Base_ptr *pp_Var14;
  _Self __tmp;
  string *psVar15;
  MultiViewChannelName *pMVar16;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  layerToPart;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  viewsInLayers;
  string lname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Self __tmp_1;
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_a0;
  string local_80;
  _Base_ptr *local_60 [2];
  _Base_ptr local_50 [2];
  MultiViewChannelName **local_40;
  _Rb_tree_node_base *local_38;
  
  if ((int)CONCAT71(in_register_00000011,multipart) == 0) {
    pMVar16 = *begin;
    iVar12 = 1;
    if (pMVar16 != *end) {
      do {
        pMVar16->part_number = 0;
        psVar1 = &pMVar16->view;
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 == 0) {
          std::__cxx11::string::_M_assign((string *)&pMVar16->internal_name);
        }
        else {
          MultiViewChannelName::getLayer_abi_cxx11_(&local_e0.first,pMVar16);
          iVar3 = std::__cxx11::string::compare((char *)&local_e0);
          if (iVar3 == 0) {
            __n_00 = (pMVar16->view)._M_string_length;
            if ((__n_00 == heroView->_M_string_length) &&
               ((__n_00 == 0 ||
                (iVar3 = bcmp((psVar1->_M_dataplus)._M_p,(heroView->_M_dataplus)._M_p,__n_00),
                iVar3 == 0)))) {
              std::__cxx11::string::_M_assign((string *)&pMVar16->internal_name);
            }
            else {
              local_140._M_impl._0_8_ = &local_140._M_impl.super__Rb_tree_header._M_header._M_parent
              ;
              pcVar2 = (psVar1->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>((string *)&local_140,pcVar2,pcVar2 + __n_00)
              ;
              std::__cxx11::string::append((char *)&local_140);
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)(pMVar16->name)._M_dataplus._M_p);
              pp_Var14 = &local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar8 = puVar9 + 2;
              if ((_Base_ptr *)*puVar9 == (_Base_ptr *)plVar8) {
                local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
                local_110._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar9[3];
                local_110._M_impl._0_8_ = pp_Var14;
              }
              else {
                local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
                local_110._M_impl._0_8_ = (_Base_ptr *)*puVar9;
              }
              local_110._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar9[1];
              *puVar9 = plVar8;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::__cxx11::string::operator=
                        ((string *)&pMVar16->internal_name,(string *)&local_110);
              if ((_Base_ptr *)local_110._M_impl._0_8_ != pp_Var14) {
                operator_delete((void *)local_110._M_impl._0_8_,
                                (ulong)((long)&(local_110._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              p_Var7 = local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
              pp_Var14 = (_Base_ptr *)local_140._M_impl._0_8_;
              if ((_Base_ptr *)local_140._M_impl._0_8_ !=
                  &local_140._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_0019037a;
            }
          }
          else {
            local_60[0] = local_50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_60,local_e0.first._M_dataplus._M_p,
                       local_e0.first._M_dataplus._M_p + local_e0.first._M_string_length);
            std::__cxx11::string::append((char *)local_60);
            pp_Var14 = &local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_60,(ulong)(pMVar16->view)._M_dataplus._M_p);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_a0.field_2._M_allocated_capacity = *psVar10;
              local_a0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar10;
              local_a0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_a0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
            pp_Var11 = (_Base_ptr *)(plVar8 + 2);
            if ((_Base_ptr *)*plVar8 == pp_Var11) {
              local_140._M_impl.super__Rb_tree_header._M_header._M_parent = *pp_Var11;
              local_140._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar8[3];
              local_140._M_impl._0_8_ = pp_Var14;
            }
            else {
              local_140._M_impl.super__Rb_tree_header._M_header._M_parent = *pp_Var11;
              local_140._M_impl._0_8_ = (_Base_ptr *)*plVar8;
            }
            local_140._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar8[1];
            *plVar8 = (long)pp_Var11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            MultiViewChannelName::getSuffix_abi_cxx11_(&local_80,pMVar16);
            p_Var7 = (_Base_ptr)0xf;
            if ((_Base_ptr *)local_140._M_impl._0_8_ != pp_Var14) {
              p_Var7 = local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
            }
            if (p_Var7 < (_Base_ptr)
                         (local_80._M_string_length +
                         local_140._M_impl.super__Rb_tree_header._M_header._0_8_)) {
              uVar13 = (_Base_ptr)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar13 = local_80.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 <
                  (_Base_ptr)
                  (local_80._M_string_length +
                  local_140._M_impl.super__Rb_tree_header._M_header._0_8_)) goto LAB_001901fd;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_80,0,(char *)0x0,local_140._M_impl._0_8_);
            }
            else {
LAB_001901fd:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)local_80._M_dataplus._M_p);
            }
            local_110._M_impl._0_8_ = &local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar8 = puVar9 + 2;
            if ((_Base_ptr *)*puVar9 == (_Base_ptr *)plVar8) {
              local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
              local_110._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar9[3];
            }
            else {
              local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
              local_110._M_impl._0_8_ = (_Base_ptr *)*puVar9;
            }
            local_110._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar9[1];
            *puVar9 = plVar8;
            puVar9[1] = 0;
            *(undefined1 *)plVar8 = 0;
            std::__cxx11::string::operator=((string *)&pMVar16->internal_name,(string *)&local_110);
            if ((_Base_ptr *)local_110._M_impl._0_8_ !=
                &local_110._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_110._M_impl._0_8_,
                              (ulong)((long)&(local_110._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if ((_Base_ptr *)local_140._M_impl._0_8_ != pp_Var14) {
              operator_delete((void *)local_140._M_impl._0_8_,
                              (ulong)((long)&(local_140._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            p_Var7 = local_50[0];
            pp_Var14 = local_60[0];
            if (local_60[0] != local_50) {
LAB_0019037a:
              operator_delete(pp_Var14,(ulong)((long)&p_Var7->_M_color + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
        }
        pMVar16 = pMVar16 + 1;
      } while (pMVar16 != *end);
    }
  }
  else {
    local_110._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_110._M_impl.super__Rb_tree_header._M_header;
    local_110._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_110._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    iVar12 = 0;
    local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar16 = *begin;
    local_110._M_impl.super__Rb_tree_header._M_header._M_right =
         local_110._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pMVar16 != *end) {
      do {
        MultiViewChannelName::getLayer_abi_cxx11_(&local_e0.first,pMVar16);
        this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&local_110,&local_e0.first);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(this,&pMVar16->view);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        pMVar16 = pMVar16 + 1;
      } while (pMVar16 != *end);
    }
    local_140._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_140._M_impl.super__Rb_tree_header._M_header;
    local_140._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_140._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_140._M_impl.super__Rb_tree_header._M_header._M_right =
         local_140._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = begin;
    if ((_Rb_tree_header *)local_110._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_110._M_impl.super__Rb_tree_header) {
      iVar12 = 0;
      p_Var7 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(p_Var7 + 2),heroView);
        if (cVar4._M_node != (_Base_ptr)&p_Var7[2]._M_parent) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1),heroView);
          pmVar5 = std::
                   map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                 *)&local_140,&local_e0);
          *pmVar5 = iVar12;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
            operator_delete(local_e0.second._M_dataplus._M_p,
                            local_e0.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
          iVar12 = iVar12 + 1;
        }
        local_38 = p_Var7;
        for (p_Var6 = p_Var7[2]._M_right; p_Var6 != (_Rb_tree_node_base *)&p_Var7[2]._M_parent;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          __n = p_Var6[1]._M_parent;
          if ((__n != (_Base_ptr)heroView->_M_string_length) ||
             ((__n != (_Base_ptr)0x0 &&
              (iVar3 = bcmp(*(void **)(p_Var6 + 1),(heroView->_M_dataplus)._M_p,(size_t)__n),
              iVar3 != 0)))) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 1));
            pmVar5 = std::
                     map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                     ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                   *)&local_140,&local_e0);
            *pmVar5 = iVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
              operator_delete(local_e0.second._M_dataplus._M_p,
                              local_e0.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
              operator_delete(local_e0.first._M_dataplus._M_p,
                              local_e0.first.field_2._M_allocated_capacity + 1);
            }
            iVar12 = iVar12 + 1;
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_38);
      } while ((_Rb_tree_header *)p_Var7 != &local_110._M_impl.super__Rb_tree_header);
    }
    if (*local_40 != *end) {
      psVar15 = (string *)&(*local_40)->internal_name;
      do {
        std::__cxx11::string::_M_assign(psVar15);
        MultiViewChannelName::getLayer_abi_cxx11_
                  (&local_a0,(MultiViewChannelName *)(psVar15 + -0x48));
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_e0,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (psVar15 + -0x28));
        pmVar5 = std::
                 map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                 ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                               *)&local_140,&local_e0);
        *(mapped_type *)(psVar15 + -8) = *pmVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
          operator_delete(local_e0.second._M_dataplus._M_p,
                          local_e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        pMVar16 = (MultiViewChannelName *)(psVar15 + 0x20);
        psVar15 = psVar15 + 0x68;
      } while (pMVar16 != *end);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
    ::~_Rb_tree(&local_140);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_110);
  }
  return iVar12;
}

Assistant:

inline int
SplitChannels (
    const T&           begin,
    const T&           end,
    bool               multipart = true,
    const std::string& heroView  = std::string ())
{
    if (!multipart)
    {
        for (T i = begin; i != end; i++)
        {
            i->part_number = 0;

            //does this have a view name set?
            if (i->view == "") { i->internal_name = i->name; }
            else
            {

                std::string lname = i->getLayer ();

                // no layer, only non-hero views get view name in layer name

                if (lname == "")
                {
                    if (i->view == heroView) { i->internal_name = i->name; }
                    else { i->internal_name = i->view + "." + i->name; }
                }
                else
                {
                    i->internal_name =
                        lname + "." + i->view + "." + i->getSuffix ();
                }
            }
        }
        // single part created
        return 1;
    }
    else
    {
        // step 1: extract individual layers and parts
        // for each layer, enumerate which views are active

        std::map<std::string, std::set<std::string>> viewsInLayers;
        for (T i = begin; i != end; i++)
        {
            viewsInLayers[i->getLayer ()].insert (i->view);
        }

        // step 2: assign a part number to each layer/view

        std::map<std::pair<std::string, std::string>, int> layerToPart;

        int partCount = 0;

        for (std::map<std::string, std::set<std::string>>::const_iterator
                 layer = viewsInLayers.begin ();
             layer != viewsInLayers.end ();
             layer++)
        {
            // if this layer has a heroView, insert that first
            bool layer_has_hero =
                layer->second.find (heroView) != layer->second.end ();
            if (layer_has_hero)
            {
                layerToPart[std::make_pair (layer->first, heroView)] =
                    partCount++;
            }

            // insert other layers which aren't the hero view
            for (std::set<std::string>::const_iterator view =
                     layer->second.begin ();
                 view != layer->second.end ();
                 view++)
            {
                if (*view != heroView)
                {
                    layerToPart[std::make_pair (layer->first, *view)] =
                        partCount++;
                }
            }
        }

        // step 3: update part number of each provided channel

        for (T i = begin; i != end; i++)
        {
            i->internal_name = i->name;
            i->part_number =
                layerToPart[std::make_pair (i->getLayer (), i->view)];
        }

        // return number of parts created
        return partCount;
    }
}